

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall
dmlc::JSONWriter::
WriteObjectKeyValue<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (JSONWriter *this,string *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value)

{
  pointer puVar1;
  ostream *poVar2;
  string asStack_48 [32];
  
  if ((this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1] != 0) {
    std::operator<<(this->os_,", ");
  }
  WriteSeperator(this);
  std::operator<<(this->os_,'\"');
  poVar2 = this->os_;
  std::__cxx11::string::string(asStack_48,(string *)key);
  std::operator<<(poVar2,asStack_48);
  std::__cxx11::string::~string(asStack_48);
  std::operator<<(this->os_,"\": ");
  puVar1 = (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
  *puVar1 = *puVar1 + 1;
  json::
  ArrayHandler<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::Write(this,value);
  return;
}

Assistant:

inline void JSONWriter::WriteObjectKeyValue(const std::string &key,
                                            const ValueType &value) {
  if (scope_counter_.back() > 0) {
    Extend(os_, ", ");
  }
  WriteSeperator();
  Extend(os_, '\"');
  Extend(os_, key);
  Extend(os_, "\": ");
  scope_counter_.back() += 1;
  json::Handler<ValueType>::Write(this, value);
}